

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

string * __thiscall
soul::makeUID_abi_cxx11_(string *__return_storage_ptr__,soul *this,ModuleBase *m)

{
  soul *this_00;
  long *plVar1;
  string_view name;
  long *local_c8;
  long local_b8;
  long lStack_b0;
  string local_a8;
  string local_88;
  IdentifierPath local_68;
  
  (**(code **)(*(long *)this + 0x70))(&local_68);
  IdentifierPath::toString_abi_cxx11_(&local_a8,&local_68);
  Program::stripRootNamespaceFromQualifiedPath(&local_88,&local_a8);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x289106);
  name._M_str = plVar1 + 2;
  if ((long *)*plVar1 == name._M_str) {
    local_b8 = *name._M_str;
    lStack_b0 = plVar1[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *name._M_str;
    local_c8 = (long *)*plVar1;
  }
  this_00 = (soul *)plVar1[1];
  *plVar1 = (long)name._M_str;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  name._M_len = (size_t)local_c8;
  makeUID_abi_cxx11_(__return_storage_ptr__,this_00,name);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_68.pathSections.numActive = 0;
  if ((8 < local_68.pathSections.numAllocated) && (local_68.pathSections.items != (Identifier *)0x0)
     ) {
    operator_delete__(local_68.pathSections.items);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string makeUID (AST::ModuleBase& m)             { return makeUID ("mod_" + Program::stripRootNamespaceFromQualifiedPath (m.getFullyQualifiedDisplayPath().toString())); }